

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

nhdp_l2hop * nhdp_db_link_2hop_add(nhdp_link *lnk,netaddr *addr)

{
  nhdp_interface *pnVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t uVar5;
  nhdp_l2hop *l2hop;
  
  l2hop = (nhdp_l2hop *)oonf_class_malloc(&_l2hop_info);
  if (l2hop != (nhdp_l2hop *)0x0) {
    uVar5 = addr->_prefix_len;
    (l2hop->twohop_addr)._type = addr->_type;
    (l2hop->twohop_addr)._prefix_len = uVar5;
    uVar2 = *(undefined4 *)(addr->_addr + 4);
    uVar3 = *(undefined4 *)(addr->_addr + 8);
    uVar4 = *(undefined4 *)(addr->_addr + 0xc);
    *(undefined4 *)(l2hop->twohop_addr)._addr = *(undefined4 *)addr->_addr;
    *(undefined4 *)((l2hop->twohop_addr)._addr + 4) = uVar2;
    *(undefined4 *)((l2hop->twohop_addr)._addr + 8) = uVar3;
    *(undefined4 *)((l2hop->twohop_addr)._addr + 0xc) = uVar4;
    (l2hop->_link_node).key = l2hop;
    l2hop->link = lnk;
    (l2hop->_vtime).class = &_l2hop_vtime_info;
    avl_insert(&lnk->_2hop,&l2hop->_link_node);
    pnVar1 = lnk->local_if;
    (l2hop->_if_node).key = l2hop;
    avl_insert(&pnVar1->_if_twohops,&l2hop->_if_node);
    nhdp_domain_init_l2hop(l2hop);
    oonf_class_event(&_l2hop_info,l2hop,OONF_OBJECT_ADDED);
  }
  return l2hop;
}

Assistant:

struct nhdp_l2hop *
nhdp_db_link_2hop_add(struct nhdp_link *lnk, const struct netaddr *addr) {
  struct nhdp_l2hop *l2hop;

  l2hop = oonf_class_malloc(&_l2hop_info);
  if (l2hop == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&l2hop->twohop_addr, addr, sizeof(l2hop->twohop_addr));
  l2hop->_link_node.key = &l2hop->twohop_addr;

  /* initialize back link */
  l2hop->link = lnk;

  /* initialize validity timer */
  l2hop->_vtime.class = &_l2hop_vtime_info;

  /* add to link tree */
  avl_insert(&lnk->_2hop, &l2hop->_link_node);

  /* add to interface tree */
  nhdp_interface_add_l2hop(lnk->local_if, l2hop);

  /* initialize metrics */
  nhdp_domain_init_l2hop(l2hop);

  /* trigger event */
  oonf_class_event(&_l2hop_info, l2hop, OONF_OBJECT_ADDED);

  return l2hop;
}